

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O0

void __thiscall NPC_Data::LoadShopDrop(NPC_Data *this)

{
  pointer *this_00;
  World *pWVar1;
  unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> uVar2;
  unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_> uVar3;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> uVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  uint uVar9;
  __uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true> _Var10;
  pointer pNVar11;
  reference this_01;
  mapped_type *pmVar12;
  ENF_Data *pEVar13;
  __uniq_ptr_data<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>,_true,_true> _Var14;
  pointer pNVar15;
  reference this_02;
  __uniq_ptr_data<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>,_true,_true> _Var16;
  NPC_Shop_Craft_Item *this_03;
  pointer pNVar17;
  reference pvVar18;
  reference this_04;
  __uniq_ptr_data<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>,_true,_true> _Var19;
  pointer pNVar20;
  reference pvVar21;
  reference this_05;
  Config *this_06;
  reference ppVar22;
  size_type sVar23;
  reference pvVar24;
  NPC_Citizenship *this_07;
  Home *pHVar25;
  char *pcVar26;
  undefined8 uVar27;
  pointer pNVar28;
  reference pvVar29;
  int subject;
  int subject_00;
  int subject_01;
  int extraout_EDX;
  int extraout_EDX_00;
  int subject_02;
  int subject_03;
  double dVar30;
  bool local_8a9;
  bool local_85d;
  string local_5b0;
  string local_590;
  int local_570;
  byte local_569;
  int index_1;
  string local_548;
  string local_528;
  int local_508;
  byte local_501;
  int index;
  string local_4e0;
  Home *local_4c0;
  Home *home;
  string local_4b0;
  undefined1 local_490 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  hc;
  iterator __end2;
  iterator __begin2;
  Config *__range2;
  key_type local_3f8;
  short local_3d2;
  short home_vend_id;
  unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> skill;
  size_t i_3;
  undefined1 local_3a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_3;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_340;
  iterator skills;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  allocator<char> local_2d1;
  key_type local_2d0;
  short local_2aa;
  value_type local_2a8;
  int iStack_2a4;
  short skills_vend_id;
  NPC_Shop_Craft_Ingredient ingredient;
  int ii;
  vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> ingredients;
  unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_> item_1;
  size_t i_2;
  undefined1 local_258 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_2;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_1f8;
  unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_> local_1f0;
  unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_> item;
  size_t i_1;
  undefined1 local_1c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_160;
  iterator shops;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  allocator<char> local_f1;
  key_type local_f0;
  short local_cc;
  allocator<char> local_c9;
  undefined1 local_c8 [4];
  short shop_vend_id;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> local_a8;
  unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_> drop;
  size_t i;
  double chance_offset;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  local_18;
  iterator drops;
  NPC_Data *this_local;
  
  drops.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
               )this;
  UnloadShopDrop(this);
  pWVar1 = this->world;
  util::to_string_abi_cxx11_(&local_38,(util *)(ulong)(uint)(int)this->id,subject);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
       ::find(&(pWVar1->drops_config).
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::end(&(this->world->drops_config).
                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     );
  bVar5 = std::__detail::operator!=
                    (&local_18,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      *)&parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar5) {
    ppVar22 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
              ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                           *)&local_18);
    util::variant::operator_cast_to_string(&local_88,&ppVar22->second);
    util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,',',&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    sVar23 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    if (sVar23 < 2) {
LAB_001f8804:
      bVar5 = false;
    }
    else {
      sVar23 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
      if ((sVar23 & 3) == 0) {
        i = 0;
        sVar23 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68);
        std::
        vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
        ::resize(&this->drops,sVar23 >> 2);
        for (drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
             super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
             super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                  (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                  (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)0x0;
            uVar4._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                 super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                 super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl,
            _Var10.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68),
            (ulong)uVar4._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                   super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                   super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl <
            (ulong)_Var10.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
                   super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                   super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl;
            drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>._M_t.
            super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
            super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl =
                 (__uniq_ptr_data<NPC_Drop,_std::default_delete<NPC_Drop>,_true,_true>)
                 ((long)drop._M_t.super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                        _M_t.super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                        super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 4)) {
          pNVar11 = (pointer)operator_new(0x20);
          std::unique_ptr<NPC_Drop,std::default_delete<NPC_Drop>>::
          unique_ptr<std::default_delete<NPC_Drop>,void>
                    ((unique_ptr<NPC_Drop,std::default_delete<NPC_Drop>> *)&local_a8,pNVar11);
          pvVar24 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68,
                                 (size_type)
                                 drop._M_t.
                                 super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>.
                                 super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl);
          iVar8 = util::to_int(pvVar24);
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          pNVar11->id = (unsigned_short)iVar8;
          pvVar24 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68,
                                 (long)drop._M_t.
                                       super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>
                                       .super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 1);
          iVar8 = util::to_int(pvVar24);
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          pNVar11->min = iVar8;
          pvVar24 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68,
                                 (long)drop._M_t.
                                       super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>
                                       .super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 2);
          iVar8 = util::to_int(pvVar24);
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          pNVar11->max = iVar8;
          pvVar24 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68,
                                 (long)drop._M_t.
                                       super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>
                                       .super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl + 3);
          dVar30 = util::to_float(pvVar24);
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          pNVar11->chance = dVar30;
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          pNVar11->chance_offset = (double)i;
          pNVar11 = std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator->(&local_a8)
          ;
          i = (size_t)(pNVar11->chance + (double)i);
          this_01 = std::
                    vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                    ::operator[](&this->drops,
                                 (ulong)drop._M_t.
                                        super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_NPC_Drop_*,_std::default_delete<NPC_Drop>_>
                                        .super__Head_base<0UL,_NPC_Drop_*,_false>._M_head_impl >> 2)
          ;
          std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::operator=(this_01,&local_a8);
          std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>::~unique_ptr(&local_a8);
        }
        if ((double)i <= 100.001) {
          this->drops_chance_total = 100.0;
        }
        else {
          this->drops_chance_total = (double)i;
          pWVar1 = this->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c8,"DropRateMode",&local_c9);
          pmVar12 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ::operator[](&(pWVar1->config).
                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                 ,(key_type *)local_c8);
          iVar8 = util::variant::operator_cast_to_int(pmVar12);
          std::__cxx11::string::~string((string *)local_c8);
          std::allocator<char>::~allocator(&local_c9);
          if (iVar8 == 3) {
            Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally."
                         ,this->drops_chance_total,(ulong)(uint)(int)this->id);
          }
        }
        goto LAB_001f8804;
      }
      Console::Wrn("skipping invalid drop data for NPC #%i",(ulong)(uint)(int)this->id);
      bVar5 = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    if (bVar5) {
      return;
    }
  }
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Version",&local_f1);
  pmVar12 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->shops_config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_f0);
  iVar8 = util::variant::operator_cast_to_int(pmVar12);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if (iVar8 < 2) {
    local_cc = this->id;
  }
  else {
    pEVar13 = ENF(this);
    local_cc = pEVar13->vendor_id;
  }
  pEVar13 = ENF(this);
  if ((pEVar13->type == Shop) && (0 < local_cc)) {
    pWVar1 = this->world;
    util::to_string_abi_cxx11_((string *)&shops,(util *)(ulong)(uint)(int)local_cc,subject_00);
    std::operator+(&local_138,(string *)&shops,".name");
    pmVar12 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->shops_config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_138);
    util::variant::operator_cast_to_string(&local_118,pmVar12);
    std::__cxx11::string::operator=((string *)&this->shop_name,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&shops);
    pWVar1 = this->world;
    util::to_string_abi_cxx11_(&local_1a0,(util *)(ulong)(uint)(int)local_cc,subject_01);
    std::operator+(&local_180,&local_1a0,".trade");
    local_160._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
         ::find(&(pWVar1->shops_config).
                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    parts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ::end(&(this->world->shops_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       );
    bVar5 = std::__detail::operator!=
                      (&local_160,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                        *)&parts_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar8 = extraout_EDX;
    if (bVar5) {
      ppVar22 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                             *)&local_160);
      util::variant::operator_cast_to_string((string *)&i_1,&ppVar22->second);
      util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0,',',(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      sVar23 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1c0);
      if (sVar23 < 2) {
LAB_001f8e82:
        bVar5 = false;
      }
      else {
        sVar23 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c0);
        if (sVar23 % 3 == 0) {
          sVar23 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1c0);
          std::
          vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
          ::resize(&this->shop_trade,sVar23 / 3);
          for (item._M_t.
               super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
               .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl =
                    (__uniq_ptr_data<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>,_true,_true>
                     )(__uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                       )0x0;
              uVar3._M_t.
              super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>.
              _M_t.
              super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
              .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl =
                   item._M_t.
                   super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                   .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl,
              _Var14.
              super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>.
              _M_t.
              super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
              .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1c0),
              (ulong)uVar3._M_t.
                     super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                     .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl <
              (ulong)_Var14.
                     super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                     .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl;
              item._M_t.
              super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>.
              _M_t.
              super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
              .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl =
                   (__uniq_ptr_data<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>,_true,_true>
                    )((long)item._M_t.
                            super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                            .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl + 3))
          {
            pNVar15 = (pointer)operator_new(0xc);
            std::unique_ptr<NPC_Shop_Trade_Item,std::default_delete<NPC_Shop_Trade_Item>>::
            unique_ptr<std::default_delete<NPC_Shop_Trade_Item>,void>
                      ((unique_ptr<NPC_Shop_Trade_Item,std::default_delete<NPC_Shop_Trade_Item>> *)
                       &local_1f0,pNVar15);
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_1c0,
                                   (size_type)
                                   item._M_t.
                                   super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                                   .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>._M_head_impl
                                  );
            iVar8 = util::to_int(pvVar24);
            pNVar15 = std::
                      unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                      operator->(&local_1f0);
            pNVar15->id = (unsigned_short)iVar8;
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_1c0,
                                   (long)item._M_t.
                                         super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>.
                                         _M_head_impl + 1);
            iVar8 = util::to_int(pvVar24);
            pNVar15 = std::
                      unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                      operator->(&local_1f0);
            pNVar15->buy = iVar8;
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_1c0,
                                   (long)item._M_t.
                                         super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>.
                                         _M_head_impl + 2);
            iVar8 = util::to_int(pvVar24);
            pNVar15 = std::
                      unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                      operator->(&local_1f0);
            pNVar15->sell = iVar8;
            pNVar15 = std::
                      unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                      operator->(&local_1f0);
            if ((pNVar15->buy != 0) &&
               (pNVar15 = std::
                          unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                          ::operator->(&local_1f0), pNVar15->sell != 0)) {
              pNVar15 = std::
                        unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                        operator->(&local_1f0);
              iVar8 = pNVar15->sell;
              pNVar15 = std::
                        unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
                        operator->(&local_1f0);
              if (pNVar15->buy < iVar8) {
                pNVar15 = std::
                          unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                          ::operator->(&local_1f0);
                Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.",
                             (ulong)pNVar15->id,(ulong)(uint)(int)local_cc);
              }
            }
            this_02 = std::
                      vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
                      ::operator[](&this->shop_trade,
                                   (ulong)item._M_t.
                                          super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_NPC_Shop_Trade_Item_*,_std::default_delete<NPC_Shop_Trade_Item>_>
                                          .super__Head_base<0UL,_NPC_Shop_Trade_Item_*,_false>.
                                          _M_head_impl / 3);
            std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
            operator=(this_02,&local_1f0);
            std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>::
            ~unique_ptr(&local_1f0);
          }
          goto LAB_001f8e82;
        }
        Console::Wrn("skipping invalid trade shop data for vendor #%i",(ulong)(uint)(int)local_cc);
        bVar5 = true;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c0);
      iVar8 = extraout_EDX_00;
      if (bVar5) {
        return;
      }
    }
    pWVar1 = this->world;
    util::to_string_abi_cxx11_(&local_238,(util *)(ulong)(uint)(int)local_cc,iVar8);
    std::operator+(&local_218,&local_238,".craft");
    local_1f8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
         ::find(&(pWVar1->shops_config).
                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ,&local_218);
    local_160._M_cur = local_1f8._M_cur;
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    parts_2.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ::end(&(this->world->shops_config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       );
    bVar5 = std::__detail::operator!=
                      (&local_160,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                        *)&parts_2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar5) {
      ppVar22 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                             *)&local_160);
      util::variant::operator_cast_to_string((string *)&i_2,&ppVar22->second);
      util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,',',(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
      sVar23 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_258);
      if (sVar23 < 2) {
LAB_001f9333:
        bVar5 = false;
      }
      else {
        sVar23 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_258);
        if (sVar23 % 9 == 0) {
          sVar23 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258);
          std::
          vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
          ::resize(&this->shop_craft,sVar23 / 9);
          for (item_1._M_t.
               super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
               .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                    (__uniq_ptr_data<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>,_true,_true>
                     )(__uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                       )0x0;
              _Var16.
              super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>.
              _M_t.
              super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
              .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258),
              (ulong)item_1._M_t.
                     super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                     .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl <
              (ulong)_Var16.
                     super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                     .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl;
              item_1._M_t.
              super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>.
              _M_t.
              super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
              .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl =
                   (__uniq_ptr_data<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>,_true,_true>
                    )((long)item_1._M_t.
                            super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                            .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl + 9))
          {
            this_03 = (NPC_Shop_Craft_Item *)operator_new(0x20);
            NPC_Shop_Craft_Item::NPC_Shop_Craft_Item(this_03);
            std::unique_ptr<NPC_Shop_Craft_Item,std::default_delete<NPC_Shop_Craft_Item>>::
            unique_ptr<std::default_delete<NPC_Shop_Craft_Item>,void>
                      ((unique_ptr<NPC_Shop_Craft_Item,std::default_delete<NPC_Shop_Craft_Item>> *)
                       &ingredients.
                        super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this_03);
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            vector((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *)
                   &ingredient);
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            resize((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *)
                   &ingredient,4);
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_258,
                                   (size_type)
                                   item_1._M_t.
                                   super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                   .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>._M_head_impl
                                  );
            iVar8 = util::to_int(pvVar24);
            pNVar17 = std::
                      unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
                      operator->((unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                  *)&ingredients.
                                     super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pNVar17->id = (unsigned_short)iVar8;
            for (iStack_2a4 = 0; iStack_2a4 < 4; iStack_2a4 = iStack_2a4 + 1) {
              pvVar24 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_258,
                                     (long)item_1._M_t.
                                           super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                           _M_head_impl + 1 + (long)(iStack_2a4 * 2));
              iVar8 = util::to_int(pvVar24);
              local_2a8.id = (short)iVar8;
              pvVar24 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_258,
                                     (long)item_1._M_t.
                                           super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                           .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                           _M_head_impl + 2 + (long)(iStack_2a4 * 2));
              iVar8 = util::to_int(pvVar24);
              local_2a8.amount = (char)iVar8;
              pvVar18 = std::
                        vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                        ::operator[]((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                      *)&ingredient,(long)iStack_2a4);
              *pvVar18 = local_2a8;
            }
            pNVar17 = std::
                      unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
                      operator->((unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                  *)&ingredients.
                                     super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            operator=(&pNVar17->ingredients,
                      (vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                       *)&ingredient);
            this_04 = std::
                      vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                      ::operator[](&this->shop_craft,
                                   (ulong)item_1._M_t.
                                          super___uniq_ptr_impl<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_NPC_Shop_Craft_Item_*,_std::default_delete<NPC_Shop_Craft_Item>_>
                                          .super__Head_base<0UL,_NPC_Shop_Craft_Item_*,_false>.
                                          _M_head_impl / 9);
            std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
            operator=(this_04,(unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                               *)&ingredients.
                                  super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
            ~vector((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *
                    )&ingredient);
            std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>::
            ~unique_ptr((unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>
                         *)&ingredients.
                            super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          goto LAB_001f9333;
        }
        Console::Wrn("skipping invalid craft shop data for vendor #%i",(ulong)(uint)(int)local_cc);
        bVar5 = true;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
      if (bVar5) {
        return;
      }
    }
  }
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Version",&local_2d1);
  pmVar12 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->skills_config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_2d0);
  iVar8 = util::variant::operator_cast_to_int(pmVar12);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  if (iVar8 < 2) {
    local_2aa = this->id;
  }
  else {
    pEVar13 = ENF(this);
    local_2aa = pEVar13->vendor_id;
  }
  pEVar13 = ENF(this);
  if ((pEVar13->type != Skills) || (local_2aa < 1)) goto LAB_001f9cfc;
  pWVar1 = this->world;
  util::to_string_abi_cxx11_((string *)&skills,(util *)(ulong)(uint)(int)local_2aa,subject_02);
  std::operator+(&local_318,(string *)&skills,".name");
  pmVar12 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->skills_config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_318);
  util::variant::operator_cast_to_string(&local_2f8,pmVar12);
  std::__cxx11::string::operator=((string *)&this->skill_name,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&skills);
  pWVar1 = this->world;
  util::to_string_abi_cxx11_(&local_380,(util *)(ulong)(uint)(int)local_2aa,subject_03);
  std::operator+(&local_360,&local_380,".learn");
  local_340._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
       ::find(&(pWVar1->skills_config).
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  parts_3.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::end(&(this->world->skills_config).
                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     );
  bVar5 = std::__detail::operator!=
                    (&local_340,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      *)&parts_3.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar5) goto LAB_001f9cfc;
  ppVar22 = std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
            ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                         *)&local_340);
  util::variant::operator_cast_to_string((string *)&i_3,&ppVar22->second);
  util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3a0,',',(string *)&i_3);
  std::__cxx11::string::~string((string *)&i_3);
  sVar23 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3a0);
  if (sVar23 < 2) {
LAB_001f9cc0:
    bVar5 = false;
  }
  else {
    sVar23 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3a0);
    if (sVar23 % 0xe == 0) {
      sVar23 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3a0);
      std::
      vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
      ::resize(&this->skill_learn,sVar23 / 0xe);
      for (skill._M_t.super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>.
           _M_t.super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
           super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl =
                (__uniq_ptr_data<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>,_true,_true>)
                (__uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>)0x0;
          uVar2._M_t.super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>.
          _M_t.super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
          super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl =
               skill._M_t.
               super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
               super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
               super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl,
          _Var19.super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
          super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
          super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl =
               (__uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3a0),
          (ulong)uVar2._M_t.
                 super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
                 super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
                 super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl <
          (ulong)_Var19.
                 super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>._M_t.
                 super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
                 super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl;
          skill._M_t.super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>.
          _M_t.super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>.
          super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl =
               (__uniq_ptr_data<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>,_true,_true>)
               ((long)skill._M_t.
                      super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                      .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl + 0xe)) {
        pNVar20 = (pointer)operator_new(0x20);
        std::unique_ptr<NPC_Learn_Skill,std::default_delete<NPC_Learn_Skill>>::
        unique_ptr<std::default_delete<NPC_Learn_Skill>,void>
                  ((unique_ptr<NPC_Learn_Skill,std::default_delete<NPC_Learn_Skill>> *)
                   &stack0xfffffffffffffc30,pNVar20);
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (size_type)
                               skill._M_t.
                               super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                               .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->id = (unsigned_short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               1);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->cost = iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               2);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->levelreq = (uchar)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               3);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->classreq = (uchar)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               4);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pvVar21 = std::array<short,_4UL>::operator[](&pNVar20->skillreq,0);
        *pvVar21 = (value_type_conflict4)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               5);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pvVar21 = std::array<short,_4UL>::operator[](&pNVar20->skillreq,1);
        *pvVar21 = (value_type_conflict4)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               6);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pvVar21 = std::array<short,_4UL>::operator[](&pNVar20->skillreq,2);
        *pvVar21 = (value_type_conflict4)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               7);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pvVar21 = std::array<short,_4UL>::operator[](&pNVar20->skillreq,3);
        *pvVar21 = (value_type_conflict4)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               8);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->strreq = (short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               9);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->intreq = (short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               10);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->wisreq = (short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               0xb);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->agireq = (short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               0xc);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->conreq = (short)iVar8;
        pvVar24 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a0,
                               (long)skill._M_t.
                                     super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                     .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl +
                               0xd);
        iVar8 = util::to_int(pvVar24);
        pNVar20 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                  operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                             &stack0xfffffffffffffc30);
        pNVar20->chareq = (short)iVar8;
        this_05 = std::
                  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                  ::operator[](&this->skill_learn,
                               (ulong)skill._M_t.
                                      super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                      .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl
                               / 0xe);
        std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::operator=
                  (this_05,(unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                           &stack0xfffffffffffffc30);
        std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::~unique_ptr
                  ((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                   &stack0xfffffffffffffc30);
      }
      goto LAB_001f9cc0;
    }
    Console::Err("WARNING: skipping invalid skill learn data for vendor #%i",
                 (ulong)(uint)(int)local_2aa);
    bVar5 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a0);
  if (bVar5) {
    return;
  }
LAB_001f9cfc:
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"Version",(allocator<char> *)((long)&__range2 + 7));
  pmVar12 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->home_config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_3f8);
  iVar8 = util::variant::operator_cast_to_int(pmVar12);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  if (iVar8 < 2) {
    local_3d2 = this->id;
  }
  else {
    pEVar13 = ENF(this);
    local_3d2 = pEVar13->vendor_id;
  }
  pEVar13 = ENF(this);
  if ((pEVar13->type == Inn) && (0 < local_3d2)) {
    do {
      this_06 = &this->world->home_config;
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::begin(&this_06->
                        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      );
      hc.second._56_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::end(&this_06->
                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                );
      while( true ) {
        bVar5 = std::__detail::operator!=
                          (&__end2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                           ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                             *)&hc.second.type);
        if (!bVar5) {
          return;
        }
        ppVar22 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                  ::operator*(&__end2);
        this_00 = &parts_4.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                *)this_00,ppVar22);
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_490,'.',(string *)this_00);
        sVar23 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_490);
        if (sVar23 < 2) {
          chance_offset._4_4_ = 0x13;
        }
        else {
          bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->citizenship);
          home._7_1_ = 0;
          bVar5 = false;
          if (!bVar6) {
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_490,1);
            bVar6 = std::operator==(pvVar24,"innkeeper");
            bVar5 = false;
            if (bVar6) {
              util::variant::operator_cast_to_string
                        (&local_4b0,(variant *)((long)&hc.first.field_2 + 8));
              home._7_1_ = 1;
              iVar8 = util::to_int(&local_4b0);
              bVar5 = iVar8 == local_3d2;
            }
          }
          if ((home._7_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_4b0);
          }
          if (bVar5) {
            this_07 = (NPC_Citizenship *)operator_new(0xe0);
            NPC_Citizenship::NPC_Citizenship(this_07);
            std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::reset
                      (&this->citizenship,this_07);
            pvVar24 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_490,0);
            pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                      operator->(&this->citizenship);
            std::__cxx11::string::operator=((string *)pNVar28,(string *)pvVar24);
            pWVar1 = this->world;
            pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                      operator->(&this->citizenship);
            std::__cxx11::string::string((string *)&local_4e0,(string *)pNVar28);
            pHVar25 = World::GetHome(pWVar1,&local_4e0);
            std::__cxx11::string::~string((string *)&local_4e0);
            local_4c0 = pHVar25;
            if (pHVar25 == (Home *)0x0) {
              uVar9 = (uint)local_3d2;
              std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::operator->
                        (&this->citizenship);
              uVar27 = std::__cxx11::string::c_str();
              Console::Wrn("Vendor #%i\'s innkeeper set on non-existent home: %s",(ulong)uVar9,
                           uVar27);
            }
            else {
              pEVar13 = ENF(this);
              local_4c0->innkeeper_vend = (int)pEVar13->vendor_id;
            }
            chance_offset._4_4_ = 0x11;
          }
          else {
            bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->citizenship);
            local_501 = 0;
            local_85d = false;
            if (bVar5) {
              pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                        operator->(&this->citizenship);
              pvVar24 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_490,0);
              _Var7 = std::operator==(&pNVar28->home,pvVar24);
              local_85d = false;
              if (_Var7) {
                pvVar24 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_490,1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_490,1);
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)&index,(ulong)pvVar24);
                local_501 = 1;
                local_85d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&index,"question");
              }
            }
            if ((local_501 & 1) != 0) {
              std::__cxx11::string::~string((string *)&index);
            }
            if (local_85d == false) {
              bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->citizenship);
              local_569 = 0;
              local_8a9 = false;
              if (bVar5) {
                pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                          operator->(&this->citizenship);
                pvVar24 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_490,0);
                _Var7 = std::operator==(&pNVar28->home,pvVar24);
                local_8a9 = false;
                if (_Var7) {
                  pvVar24 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_490,1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_490,1);
                  std::__cxx11::string::length();
                  std::__cxx11::string::substr((ulong)&index_1,(ulong)pvVar24);
                  local_569 = 1;
                  local_8a9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&index_1,"answer");
                }
              }
              if ((local_569 & 1) != 0) {
                std::__cxx11::string::~string((string *)&index_1);
              }
              if (local_8a9 != false) {
                pvVar24 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_490,1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_490,1);
                std::__cxx11::string::length();
                pcVar26 = (char *)std::__cxx11::string::operator[]((ulong)pvVar24);
                local_570 = *pcVar26 + -0x31;
                if ((local_570 < 0) || (2 < local_570)) {
                  util::variant::operator_cast_to_string
                            (&local_590,(variant *)((long)&hc.first.field_2 + 8));
                  uVar27 = std::__cxx11::string::c_str();
                  Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i",
                               uVar27,(ulong)(uint)(int)local_3d2);
                  std::__cxx11::string::~string((string *)&local_590);
                }
                util::variant::operator_cast_to_string
                          (&local_5b0,(variant *)((long)&hc.first.field_2 + 8));
                pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                          operator->(&this->citizenship);
                pvVar29 = std::
                          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                          ::operator[](&pNVar28->answers,(long)local_570);
                std::__cxx11::string::operator=((string *)pvVar29,(string *)&local_5b0);
                std::__cxx11::string::~string((string *)&local_5b0);
              }
            }
            else {
              pvVar24 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_490,1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_490,1);
              std::__cxx11::string::length();
              pcVar26 = (char *)std::__cxx11::string::operator[]((ulong)pvVar24);
              local_508 = *pcVar26 + -0x31;
              if ((local_508 < 0) || (2 < local_508)) {
                util::variant::operator_cast_to_string
                          (&local_528,(variant *)((long)&hc.first.field_2 + 8));
                uVar27 = std::__cxx11::string::c_str();
                Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i",
                             uVar27,(ulong)(uint)(int)local_3d2);
                std::__cxx11::string::~string((string *)&local_528);
              }
              util::variant::operator_cast_to_string
                        (&local_548,(variant *)((long)&hc.first.field_2 + 8));
              pNVar28 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::
                        operator->(&this->citizenship);
              pvVar29 = std::
                        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        ::operator[](&pNVar28->questions,(long)local_508);
              std::__cxx11::string::operator=((string *)pvVar29,(string *)&local_548);
              std::__cxx11::string::~string((string *)&local_548);
            }
            chance_offset._4_4_ = 0;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_490);
        if (chance_offset._4_4_ == 0) {
          chance_offset._4_4_ = 0;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                 *)&parts_4.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((chance_offset._4_4_ != 0) && (chance_offset._4_4_ == 0x11)) break;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
        ::operator++(&__end2);
      }
    } while( true );
  }
  return;
}

Assistant:

void NPC_Data::LoadShopDrop()
{
	this->UnloadShopDrop();

	Config::iterator drops = this->world->drops_config.find(util::to_string(this->id));
	if (drops != this->world->drops_config.end())
	{
		std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*drops).second));

		if (parts.size() > 1)
		{
			if (parts.size() % 4 != 0)
			{
				Console::Wrn("skipping invalid drop data for NPC #%i", id);
				return;
			}

			double chance_offset = 0.0;

			this->drops.resize(parts.size() / 4);

			for (std::size_t i = 0; i < parts.size(); i += 4)
			{
				std::unique_ptr<NPC_Drop> drop(new NPC_Drop);

				drop->id = util::to_int(parts[i]);
				drop->min = util::to_int(parts[i+1]);
				drop->max = util::to_int(parts[i+2]);
				drop->chance = util::to_float(parts[i+3]);
				drop->chance_offset = chance_offset;

				chance_offset += drop->chance;

				this->drops[i/4] = std::move(drop);
			}

			if (chance_offset > 100.001)
			{
				this->drops_chance_total = chance_offset;

				if (static_cast<int>(this->world->config["DropRateMode"]) == 3)
					Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally.", this->id, this->drops_chance_total);
			}
			else
			{
				this->drops_chance_total = 100.0;
			}
		}
	}

	short shop_vend_id;

	if (int(this->world->shops_config["Version"]) < 2)
	{
		shop_vend_id = this->id;
	}
	else
	{
		shop_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Shop && shop_vend_id > 0)
	{
		this->shop_name = static_cast<std::string>(this->world->shops_config[util::to_string(shop_vend_id) + ".name"]);
		Config::iterator shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".trade");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 3 != 0)
				{
					Console::Wrn("skipping invalid trade shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_trade.resize(parts.size() / 3);

				for (std::size_t i = 0; i < parts.size(); i += 3)
				{
					std::unique_ptr<NPC_Shop_Trade_Item> item(new NPC_Shop_Trade_Item);
					item->id = util::to_int(parts[i]);
					item->buy = util::to_int(parts[i+1]);
					item->sell = util::to_int(parts[i+2]);

					if (item->buy != 0 && item->sell != 0 && item->sell > item->buy)
					{
						Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.", item->id, shop_vend_id);
					}

					this->shop_trade[i/3] = std::move(item);
				}
			}
		}

		shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".craft");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 9 != 0)
				{
					Console::Wrn("skipping invalid craft shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_craft.resize(parts.size() / 9);

				for (std::size_t i = 0; i < parts.size(); i += 9)
				{
					std::unique_ptr<NPC_Shop_Craft_Item> item(new NPC_Shop_Craft_Item);
					std::vector<NPC_Shop_Craft_Ingredient> ingredients;
					ingredients.resize(4);

					item->id = util::to_int(parts[i]);

					for (int ii = 0; ii < 4; ++ii)
					{
						NPC_Shop_Craft_Ingredient ingredient;
						ingredient.id = util::to_int(parts[i+1+ii*2]);
						ingredient.amount = util::to_int(parts[i+2+ii*2]);
						ingredients[ii] = ingredient;
					}

					item->ingredients = ingredients;

					this->shop_craft[i/9] = std::move(item);
				}
			}
		}
	}

	short skills_vend_id;

	if (int(this->world->skills_config["Version"]) < 2)
	{
		skills_vend_id = this->id;
	}
	else
	{
		skills_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Skills && skills_vend_id > 0)
	{
		this->skill_name = static_cast<std::string>(this->world->skills_config[util::to_string(skills_vend_id) + ".name"]);
		Config::iterator skills = this->world->skills_config.find(util::to_string(skills_vend_id) + ".learn");
		if (skills != this->world->skills_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*skills).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 14 != 0)
				{
					Console::Err("WARNING: skipping invalid skill learn data for vendor #%i", skills_vend_id);
					return;
				}

				this->skill_learn.resize(parts.size() / 14);

				for (std::size_t i = 0; i < parts.size(); i += 14)
				{
					std::unique_ptr<NPC_Learn_Skill> skill(new NPC_Learn_Skill);

					skill->id = util::to_int(parts[i]);
					skill->cost = util::to_int(parts[i+1]);
					skill->levelreq = util::to_int(parts[i+2]);
					skill->classreq = util::to_int(parts[i+3]);

					skill->skillreq[0] = util::to_int(parts[i+4]);
					skill->skillreq[1] = util::to_int(parts[i+5]);
					skill->skillreq[2] = util::to_int(parts[i+6]);
					skill->skillreq[3] = util::to_int(parts[i+7]);

					skill->strreq = util::to_int(parts[i+8]);
					skill->intreq = util::to_int(parts[i+9]);
					skill->wisreq = util::to_int(parts[i+10]);
					skill->agireq = util::to_int(parts[i+11]);
					skill->conreq = util::to_int(parts[i+12]);
					skill->chareq = util::to_int(parts[i+13]);

					this->skill_learn[i/14] = std::move(skill);
				}
			}
		}
	}

	short home_vend_id;

	if (int(this->world->home_config["Version"]) < 2)
	{
		home_vend_id = this->id;
	}
	else
	{
		home_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Inn && home_vend_id > 0)
	{
		restart_loop:
		UTIL_FOREACH(this->world->home_config, hc)
		{
			std::vector<std::string> parts = util::explode('.', hc.first);

			if (parts.size() < 2)
			{
				continue;
			}

			if (!this->citizenship && parts[1] == "innkeeper" && util::to_int(hc.second) == home_vend_id)
			{
				this->citizenship.reset(new NPC_Citizenship);
				this->citizenship->home = parts[0];
				Home* home = this->world->GetHome(this->citizenship->home);

				if (home)
					home->innkeeper_vend = this->ENF().vendor_id;
				else
					Console::Wrn("Vendor #%i's innkeeper set on non-existent home: %s", home_vend_id, this->citizenship->home.c_str());

				// Restart the loop so questions/answers specified before the innkeeper option will load
				goto restart_loop;
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "question")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->questions[index] = static_cast<std::string>(hc.second);
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "answer")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->answers[index] = static_cast<std::string>(hc.second);
			}
		}
	}
}